

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O1

bool __thiscall
icu_63::number::impl::SimpleModifier::semanticallyEquivalent(SimpleModifier *this,Modifier *other)

{
  ushort uVar1;
  short sVar2;
  ModifierStore *pMVar3;
  UBool UVar4;
  long lVar5;
  int len;
  int iVar6;
  bool bVar7;
  
  bVar7 = false;
  lVar5 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  if (lVar5 != 0) {
    pMVar3 = (this->fParameters).obj;
    if (pMVar3 == (ModifierStore *)0x0) {
      uVar1 = (this->fCompiledPattern).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar1 & 1) == 0) {
        if ((short)uVar1 < 0) {
          len = (this->fCompiledPattern).fUnion.fFields.fLength;
        }
        else {
          len = (int)(short)uVar1 >> 5;
        }
        sVar2 = *(short *)(lVar5 + 0x10);
        if (sVar2 < 0) {
          iVar6 = *(int *)(lVar5 + 0x14);
        }
        else {
          iVar6 = (int)sVar2 >> 5;
        }
        bVar7 = false;
        if ((((int)sVar2 & 1U) == 0) && (bVar7 = false, len == iVar6)) {
          UVar4 = UnicodeString::doEquals(&this->fCompiledPattern,(UnicodeString *)(lVar5 + 8),len);
          bVar7 = UVar4 != '\0';
        }
      }
      else {
        bVar7 = (bool)(*(byte *)(lVar5 + 0x10) & 1);
      }
      if ((bVar7 == false) || (this->fField != *(Field *)(lVar5 + 0x48))) {
        bVar7 = false;
      }
      else {
        bVar7 = this->fStrong == (bool)*(char *)(lVar5 + 0x4c);
      }
    }
    else {
      bVar7 = pMVar3 == *(ModifierStore **)(lVar5 + 0x60);
    }
  }
  return bVar7;
}

Assistant:

bool SimpleModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const SimpleModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    if (fParameters.obj != nullptr) {
        return fParameters.obj == _other->fParameters.obj;
    }
    return fCompiledPattern == _other->fCompiledPattern
        && fField == _other->fField
        && fStrong == _other->fStrong;
}